

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterStartDocument
              (xmlTextWriterPtr writer,char *version,char *encoding,char *standalone)

{
  xmlOutputBufferPtr pxVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlLinkPtr lk;
  void *pvVar7;
  xmlCharEncodingHandlerPtr pxVar8;
  xmlBufPtr pxVar9;
  xmlChar *pxVar10;
  char *pcVar11;
  xmlParserErrors error;
  char *str;
  
  if ((writer == (xmlTextWriterPtr)0x0) || (writer->out == (xmlOutputBufferPtr)0x0)) {
    pcVar11 = "xmlTextWriterStartDocument : invalid writer!\n";
  }
  else {
    lk = xmlListFront(writer->nodes);
    if ((lk == (xmlLinkPtr)0x0) || (pvVar7 = xmlLinkGetData(lk), pvVar7 == (void *)0x0)) {
      if (encoding == (char *)0x0) {
        pxVar8 = (xmlCharEncodingHandlerPtr)0x0;
LAB_001d3d11:
        pxVar1 = writer->out;
        pxVar1->encoder = pxVar8;
        if (pxVar8 == (xmlCharEncodingHandlerPtr)0x0) {
          pxVar1->conv = (xmlBufPtr)0x0;
        }
        else {
          if (pxVar1->conv == (xmlBufPtr)0x0) {
            pxVar9 = xmlBufCreateSize(4000);
            writer->out->conv = pxVar9;
          }
          xmlCharEncOutput(writer->out,1);
          if ((writer->doc != (xmlDocPtr)0x0) && (writer->doc->encoding == (xmlChar *)0x0)) {
            pxVar10 = xmlStrdup((xmlChar *)writer->out->encoder->name);
            writer->doc->encoding = pxVar10;
          }
        }
        iVar2 = xmlOutputBufferWriteString(writer->out,"<?xml version=");
        if (iVar2 < 0) {
          return -1;
        }
        pcVar11 = &writer->qchar;
        iVar3 = xmlOutputBufferWrite(writer->out,1,pcVar11);
        if (iVar3 < 0) {
          return -1;
        }
        str = "1.0";
        if (version != (char *)0x0) {
          str = version;
        }
        iVar4 = xmlOutputBufferWriteString(writer->out,str);
        if (iVar4 < 0) {
          return -1;
        }
        iVar5 = xmlOutputBufferWrite(writer->out,1,pcVar11);
        if (iVar5 < 0) {
          return -1;
        }
        iVar5 = iVar3 + iVar2 + iVar4 + iVar5;
        if (writer->out->encoder != (xmlCharEncodingHandlerPtr)0x0) {
          iVar2 = xmlOutputBufferWriteString(writer->out," encoding=");
          if (iVar2 < 0) {
            return -1;
          }
          iVar3 = xmlOutputBufferWrite(writer->out,1,pcVar11);
          if (iVar3 < 0) {
            return -1;
          }
          iVar4 = xmlOutputBufferWriteString(writer->out,writer->out->encoder->name);
          if (iVar4 < 0) {
            return -1;
          }
          iVar6 = xmlOutputBufferWrite(writer->out,1,pcVar11);
          if (iVar6 < 0) {
            return -1;
          }
          iVar5 = iVar2 + iVar5 + iVar3 + iVar6 + iVar4;
        }
        if (standalone != (char *)0x0) {
          iVar2 = xmlOutputBufferWriteString(writer->out," standalone=");
          if (iVar2 < 0) {
            return -1;
          }
          iVar3 = xmlOutputBufferWrite(writer->out,1,pcVar11);
          if (iVar3 < 0) {
            return -1;
          }
          iVar4 = xmlOutputBufferWriteString(writer->out,standalone);
          if (iVar4 < 0) {
            return -1;
          }
          iVar6 = xmlOutputBufferWrite(writer->out,1,pcVar11);
          if (iVar6 < 0) {
            return -1;
          }
          iVar5 = iVar3 + iVar4 + iVar6 + iVar2 + iVar5;
        }
        iVar2 = xmlOutputBufferWriteString(writer->out,"?>\n");
        if (iVar2 < 0) {
          return -1;
        }
        return iVar2 + iVar5;
      }
      pxVar8 = xmlFindCharEncodingHandler(encoding);
      if (pxVar8 != (xmlCharEncodingHandlerPtr)0x0) goto LAB_001d3d11;
      pcVar11 = "xmlTextWriterStartDocument : unsupported encoding\n";
      error = XML_ERR_UNSUPPORTED_ENCODING;
      goto LAB_001d3cd1;
    }
    pcVar11 = "xmlTextWriterStartDocument : not allowed in this context!\n";
  }
  error = XML_ERR_INTERNAL_ERROR;
LAB_001d3cd1:
  xmlWriterErrMsg(writer,error,pcVar11);
  return -1;
}

Assistant:

int
xmlTextWriterStartDocument(xmlTextWriterPtr writer, const char *version,
                           const char *encoding, const char *standalone)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlCharEncodingHandlerPtr encoder;

    if ((writer == NULL) || (writer->out == NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDocument : invalid writer!\n");
        return -1;
    }

    lk = xmlListFront(writer->nodes);
    if ((lk != NULL) && (xmlLinkGetData(lk) != NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDocument : not allowed in this context!\n");
        return -1;
    }

    encoder = NULL;
    if (encoding != NULL) {
        encoder = xmlFindCharEncodingHandler(encoding);
        if (encoder == NULL) {
            xmlWriterErrMsg(writer, XML_ERR_UNSUPPORTED_ENCODING,
                            "xmlTextWriterStartDocument : unsupported encoding\n");
            return -1;
        }
    }

    writer->out->encoder = encoder;
    if (encoder != NULL) {
	if (writer->out->conv == NULL) {
	    writer->out->conv = xmlBufCreateSize(4000);
	}
        xmlCharEncOutput(writer->out, 1);
        if ((writer->doc != NULL) && (writer->doc->encoding == NULL))
            writer->doc->encoding = xmlStrdup((xmlChar *)writer->out->encoder->name);
    } else
        writer->out->conv = NULL;

    sum = 0;
    count = xmlOutputBufferWriteString(writer->out, "<?xml version=");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
    if (count < 0)
        return -1;
    sum += count;
    if (version != 0)
        count = xmlOutputBufferWriteString(writer->out, version);
    else
        count = xmlOutputBufferWriteString(writer->out, "1.0");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
    if (count < 0)
        return -1;
    sum += count;
    if (writer->out->encoder != 0) {
        count = xmlOutputBufferWriteString(writer->out, " encoding=");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count =
            xmlOutputBufferWriteString(writer->out,
                                       writer->out->encoder->name);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (standalone != 0) {
        count = xmlOutputBufferWriteString(writer->out, " standalone=");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWriteString(writer->out, standalone);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "?>\n");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}